

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void * google::CheckNotNull<void*>(char *file,int line,char *names,void **t)

{
  string *this;
  allocator<char> local_39;
  CheckOpString local_38;
  LogMessageFatal local_30;
  
  if (*t != (void *)0x0) {
    return *t;
  }
  if (g_new_hook != (code *)0x0) {
    (*g_new_hook)();
  }
  this = (string *)malloc(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this,names,&local_39);
  local_38.str_ = this;
  LogMessageFatal::LogMessageFatal(&local_30,file,line,&local_38);
  LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

T CheckNotNull(const char* file, int line, const char* names, T&& t) {
 if (t == nullptr) {
   LogMessageFatal(file, line, new std::string(names));
 }
 return std::forward<T>(t);
}